

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar.cpp
# Opt level: O0

Mat * __thiscall imagestego::experimental::impl::HaarWavelet::transform(HaarWavelet *this,Mat *mat)

{
  bool bVar1;
  int iVar2;
  Mat *pMVar3;
  _InputArray *in_RDX;
  Mat *in_RDI;
  future<cv::Mat> *f;
  iterator __end3;
  iterator __begin3;
  vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> *__range3;
  size_t i;
  vector<cv::Mat,_std::allocator<cv::Mat>_> _planes;
  vector<cv::Mat,_std::allocator<cv::Mat>_> planes;
  vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> futures;
  Mat *dst;
  Mat *in_stack_fffffffffffffd58;
  Mat *__t;
  _InputArray *in_stack_fffffffffffffd60;
  Mat *this_00;
  Size in_stack_fffffffffffffd88;
  void *in_stack_fffffffffffffd98;
  Size in_stack_fffffffffffffda0;
  Mat local_258 [96];
  reference local_1f8;
  future<cv::Mat> *local_1f0;
  __normal_iterator<std::future<cv::Mat>_*,_std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>_>
  local_1e8;
  undefined1 *local_1e0;
  Mat local_1d8 [96];
  Mat local_178 [96];
  Mat *local_118;
  Mat *local_f8;
  _OutputArray local_f0;
  _InputArray local_d8;
  _OutputArray local_c0;
  _InputArray local_a8;
  undefined1 local_80 [24];
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_68 [2];
  undefined1 local_38 [31];
  byte local_19;
  _InputArray *local_18;
  
  local_19 = 0;
  this_00 = in_RDI;
  local_18 = in_RDX;
  cv::Mat::Mat(in_RDI);
  std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>::vector
            ((vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> *)0x107f36);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)0x107f43);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)0x107f50);
  iVar2 = cv::Mat::depth((Mat *)local_18);
  if (iVar2 == 3) {
    cv::_InputArray::_InputArray(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    cv::_OutputArray::_OutputArray
              ((_OutputArray *)in_stack_fffffffffffffd60,
               (vector<cv::Mat,_std::allocator<cv::Mat>_> *)in_stack_fffffffffffffd58);
    cv::split(&local_d8,&local_f0);
    cv::_OutputArray::~_OutputArray((_OutputArray *)0x1080f4);
    cv::_InputArray::~_InputArray(&local_d8);
  }
  else {
    cv::_OutputArray::_OutputArray((_OutputArray *)this_00,in_RDI);
    cv::Mat::convertTo((_OutputArray *)local_18,(int)local_80,1.0,0.0);
    cv::_OutputArray::~_OutputArray((_OutputArray *)0x107fb9);
    cv::_InputArray::_InputArray(local_18,in_stack_fffffffffffffd58);
    cv::_OutputArray::_OutputArray
              ((_OutputArray *)local_18,
               (vector<cv::Mat,_std::allocator<cv::Mat>_> *)in_stack_fffffffffffffd58);
    cv::split(&local_a8,&local_c0);
    cv::_OutputArray::~_OutputArray((_OutputArray *)0x108008);
    cv::_InputArray::~_InputArray(&local_a8);
    in_stack_fffffffffffffd60 = local_18;
  }
  local_f8 = (Mat *)0x1;
  while( true ) {
    __t = local_f8;
    pMVar3 = (Mat *)std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size(local_68);
    if (__t == pMVar3) break;
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](local_68,(size_type)local_f8);
    local_118 = (Mat *)std::cref<cv::Mat>(__t);
    std::
    async<imagestego::experimental::impl::HaarWavelet::transform(cv::Mat_const&)::_lambda(cv::Mat_const&)_1_,std::reference_wrapper<cv::Mat_const>>
              ((type *)in_RDI,(reference_wrapper<const_cv::Mat> *)in_stack_fffffffffffffd60);
    std::vector<std::future<cv::Mat>,std::allocator<std::future<cv::Mat>>>::
    emplace_back<std::future<cv::Mat>>
              ((vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> *)this_00,
               (future<cv::Mat> *)in_RDI);
    std::future<cv::Mat>::~future((future<cv::Mat> *)0x1081e9);
    local_f8 = local_f8 + 1;
  }
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size(local_68);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::reserve
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)in_stack_fffffffffffffda0,
             (size_type)in_stack_fffffffffffffd98);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::front
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)in_stack_fffffffffffffd60);
  horizontalLifting((Mat *)in_stack_fffffffffffffd88);
  verticalLifting((Mat *)in_stack_fffffffffffffd88);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::emplace_back<cv::Mat>
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)this_00,in_RDI);
  cv::Mat::~Mat(local_178);
  cv::Mat::~Mat(local_1d8);
  local_1e0 = local_38;
  local_1e8._M_current =
       (future<cv::Mat> *)
       std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>::begin
                 ((vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> *)__t);
  local_1f0 = (future<cv::Mat> *)
              std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>::end
                        ((vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> *)__t
                        );
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::future<cv::Mat>_*,_std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>_>
                        *)in_stack_fffffffffffffd60,
                       (__normal_iterator<std::future<cv::Mat>_*,_std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>_>
                        *)__t);
    if (!bVar1) break;
    local_1f8 = __gnu_cxx::
                __normal_iterator<std::future<cv::Mat>_*,_std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>_>
                ::operator*(&local_1e8);
    std::future<cv::Mat>::get((future<cv::Mat> *)in_stack_fffffffffffffd88);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::emplace_back<cv::Mat>
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)this_00,in_RDI);
    cv::Mat::~Mat(local_258);
    __gnu_cxx::
    __normal_iterator<std::future<cv::Mat>_*,_std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>_>
    ::operator++(&local_1e8);
  }
  cv::_InputArray::_InputArray
            (in_stack_fffffffffffffd60,(vector<cv::Mat,_std::allocator<cv::Mat>_> *)__t);
  cv::_OutputArray::_OutputArray((_OutputArray *)this_00,in_RDI);
  cv::merge((_InputArray *)&stack0xfffffffffffffd90,(_OutputArray *)&stack0xfffffffffffffd78);
  cv::_OutputArray::~_OutputArray((_OutputArray *)0x108408);
  cv::_InputArray::~_InputArray((_InputArray *)&stack0xfffffffffffffd90);
  local_19 = 1;
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)this_00);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)this_00);
  std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>::~vector
            ((vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> *)this_00);
  if ((local_19 & 1) == 0) {
    cv::Mat::~Mat(in_RDI);
  }
  return this_00;
}

Assistant:

cv::Mat transform(const cv::Mat& mat) {
        cv::Mat dst;
        std::vector<std::future<cv::Mat>> futures;
        std::vector<cv::Mat> planes, _planes;
        if (mat.depth() != CV_16S) {
            mat.convertTo(dst, CV_16S);
            cv::split(dst, _planes);
        } else {
            cv::split(mat, _planes);
        }

        for (std::size_t i = 1; i != _planes.size(); ++i) {
            futures.emplace_back(std::async(
                [](const cv::Mat& mat) -> cv::Mat {
                    return verticalLifting(horizontalLifting(mat));
                },
                std::cref(_planes[i])));
        }
        planes.reserve(_planes.size());
        planes.emplace_back(verticalLifting(horizontalLifting(_planes.front())));
        for (auto&& f : futures) {
            planes.emplace_back(f.get());
        }
        cv::merge(planes, dst);
        return dst;
    }